

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::generateTextureBufferGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target)

{
  Enum<int,_2UL> EVar1;
  GLenum local_e4;
  GetNameFunc local_c0;
  int local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  TextureGenerationSpec texGen;
  GLenum queryTarget;
  GLenum target_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  *group_local;
  
  local_e4 = target;
  if (target == 0x8513) {
    local_e4 = 0x8518;
  }
  texGen.description.field_2._8_4_ = local_e4;
  texGen.description.field_2._12_4_ = target;
  TextureGenerationSpec::TextureGenerationSpec((TextureGenerationSpec *)local_70);
  local_70._0_4_ = texGen.description.field_2._12_4_;
  local_70._4_4_ = texGen.description.field_2._8_4_;
  texGen.bindTarget._0_1_ = 1;
  texGen.queryTarget = 0;
  EVar1 = glu::getTextureTargetStr(texGen.description.field_2._12_4_);
  local_c0 = EVar1.m_getName;
  local_b8 = EVar1.m_value;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_c0);
  std::operator+(&local_90,&local_b0,", initial values");
  std::__cxx11::string::operator=
            ((string *)
             &texGen.levels.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(group,(value_type *)local_70);
  TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_70);
  return;
}

Assistant:

static void generateTextureBufferGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= 0;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// actual specification tests are in texture_buffer tests, no need to do them here too
}